

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O0

Ptr<CommandBuffer>
myvk::CommandBuffer::Create(Ptr<CommandPool> *command_pool,VkCommandBufferLevel level)

{
  PFN_vkAllocateCommandBuffers p_Var1;
  VkResult VVar2;
  element_type *peVar3;
  element_type *this;
  VkDevice pVVar4;
  element_type *peVar5;
  VkCommandBufferLevel in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ptr<CommandBuffer> PVar6;
  VkCommandBufferAllocateInfo alloc_info;
  shared_ptr<myvk::CommandBuffer> ret;
  shared_ptr<myvk::CommandBuffer> *in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  VkCommandBufferAllocateInfo local_48;
  VkCommandBufferLevel local_14;
  
  local_14 = in_EDX;
  std::make_shared<myvk::CommandBuffer>();
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2ab4b4);
  std::shared_ptr<myvk::CommandPool>::operator=
            ((shared_ptr<myvk::CommandPool> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (shared_ptr<myvk::CommandPool> *)in_stack_ffffffffffffff58);
  local_48.commandPool = (VkCommandPool)0x0;
  local_48.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  local_48.commandBufferCount = 0;
  local_48.pNext = (void *)0x0;
  local_48.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_48._4_4_ = 0;
  peVar3 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ab4e7);
  local_48.commandPool = CommandPool::GetHandle(peVar3);
  p_Var1 = vkAllocateCommandBuffers;
  local_48.commandBufferCount = 1;
  local_48.level = local_14;
  peVar3 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ab52f);
  (*(peVar3->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  this = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    0x2ab54c);
  pVVar4 = Device::GetHandle(this);
  peVar5 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ab568);
  VVar2 = (*p_Var1)(pVVar4,&local_48,&peVar5->m_command_buffer);
  if (VVar2 == VK_SUCCESS) {
    std::shared_ptr<myvk::CommandBuffer>::shared_ptr
              ((shared_ptr<myvk::CommandBuffer> *)(ulong)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
  }
  else {
    std::shared_ptr<myvk::CommandBuffer>::shared_ptr
              ((shared_ptr<myvk::CommandBuffer> *)CONCAT44(VVar2,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
  }
  std::shared_ptr<myvk::CommandBuffer>::~shared_ptr((shared_ptr<myvk::CommandBuffer> *)0x2ab5eb);
  PVar6.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar6.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<CommandBuffer>)
         PVar6.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<CommandBuffer> CommandBuffer::Create(const Ptr<CommandPool> &command_pool, VkCommandBufferLevel level) {
	auto ret = std::make_shared<CommandBuffer>();
	ret->m_command_pool_ptr = command_pool;

	VkCommandBufferAllocateInfo alloc_info = {};
	alloc_info.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
	alloc_info.commandPool = command_pool->GetHandle();
	alloc_info.level = level;
	alloc_info.commandBufferCount = 1;

	if (vkAllocateCommandBuffers(command_pool->GetDevicePtr()->GetHandle(), &alloc_info, &ret->m_command_buffer) !=
	    VK_SUCCESS)
		return nullptr;
	return ret;
}